

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned_long value,
          basic_format_specs<char> *specs)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_28;
  
  local_28.num_digits = count_digits<4u,unsigned_long>(value);
  local_28.value = value;
  if (specs == (basic_format_specs<char> *)0x0) {
    bVar1 = write_ptr<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long>
            ::anon_class_16_2_92d121e5::operator()(&local_28,out.container);
  }
  else {
    bVar1 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                      (out,specs,(ulong)(uint)local_28.num_digits + 2,&local_28);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar1.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}